

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ParseResult *
read_list(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,bool square)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  element_type *peVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  ParseResult *pPVar7;
  _Node *p_Var8;
  ParseResult *extraout_RAX;
  ParseResult *extraout_RAX_00;
  ParseResult *extraout_RAX_01;
  string local_58;
  shared_ptr<ASTNode> *local_38;
  
  ((node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type = LIST;
  local_38 = node;
  skip_whitespace(is);
  iVar6 = std::istream::peek();
  paVar1 = &(__return_storage_ptr__->error).field_2;
  do {
    if (iVar6 == -1) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Unclosed list literal","");
      ParseResult::ParseResult(__return_storage_ptr__,&local_58);
      pPVar7 = extraout_RAX;
LAB_0011f7e0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        pPVar7 = extraout_RAX_01;
      }
      return pPVar7;
    }
    if ((iVar6 == 0x29) || (iVar6 == 0x5d)) {
      std::istream::get();
      if ((iVar6 != 0x5d) != square) {
        peVar3 = (local_38->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var5 = (local_38->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        __return_storage_ptr__->result = OK;
        (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar3;
        (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var5;
        (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar1;
        (__return_storage_ptr__->error)._M_string_length = 0;
        (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
        return (ParseResult *)peVar3;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Wrong closing bracket","");
      ParseResult::ParseResult(__return_storage_ptr__,&local_58);
      pPVar7 = extraout_RAX_00;
      goto LAB_0011f7e0;
    }
    pPVar7 = read_object(__return_storage_ptr__,is);
    if (__return_storage_ptr__->result != OK) {
      return pPVar7;
    }
    peVar3 = (local_38->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var8 = std::__cxx11::list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>>::
             _M_create_node<std::shared_ptr<ASTNode>const&>
                       ((list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>> *)
                        &peVar3->list,&__return_storage_ptr__->node);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    psVar2 = &(peVar3->list).
              super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    iVar6 = skip_whitespace(is);
    pcVar4 = (__return_storage_ptr__->error)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    p_Var5 = (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
  } while( true );
}

Assistant:

static ParseResult read_list(std::istream &is, const std::shared_ptr<ASTNode> &node, bool square)
{
    node->type = ast_type_t::LIST;
    skip_whitespace(is);
    int c = is.peek();
    while(c != EOF && c != ')' && c != ']')
    {
        auto object = read_object(is);
        if(object.result != parse_result_t::OK)
            return object;
        node->list.push_back(object.node);
        c = skip_whitespace(is);
    }
    if(c == EOF)
        return ParseResult("Unclosed list literal");
    is.get();
    if((c == ']') != square)
        return ParseResult("Wrong closing bracket");
    return ParseResult(node);
}